

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

void log_option(nh_option_desc *opt)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *out;
  __off_t _Var5;
  char encbuf [512];
  
  if (iflags.disable_log != '\0') {
    return;
  }
  if (logfile == -1) {
    return;
  }
  base64_encode(opt->name,encbuf);
  lprintf("\n!%s:");
  switch(opt->type) {
  case OPTTYPE_BOOL:
    pcVar3 = "b:%x";
    break;
  case OPTTYPE_INT:
    pcVar3 = "i:%d";
    break;
  case OPTTYPE_ENUM:
    pcVar3 = "e:%x";
    break;
  case OPTTYPE_STRING:
    pcVar3 = "";
    if ((opt->value).s != (char *)0x0) {
      pcVar3 = (opt->value).s;
    }
    base64_encode(pcVar3,encbuf);
    lprintf("s:%s");
    goto switchD_001aff00_default;
  case OPTTYPE_AUTOPICKUP_RULES:
    pcVar3 = autopickup_to_string((opt->value).ar);
    lprintf("a:");
    sVar4 = strlen(pcVar3);
    iVar2 = base64size((int)sVar4);
    out = (char *)malloc((long)iVar2);
    base64_encode(pcVar3,out);
    iVar2 = logfile;
    sVar4 = strlen(out);
    bVar1 = write_full(iVar2,out,sVar4);
    if (bVar1 == '\0') {
      pcVar3 = "log_option: failed to write autopickup_rules";
LAB_001b0037:
      panic(pcVar3);
    }
    goto LAB_001b003e;
  case OPTTYPE_MSGTYPE:
    pcVar3 = msgtype_to_string((opt->value).mt);
    lprintf("m:");
    sVar4 = strlen(pcVar3);
    iVar2 = base64size((int)sVar4);
    out = (char *)malloc((long)iVar2);
    base64_encode(pcVar3,out);
    iVar2 = logfile;
    sVar4 = strlen(out);
    bVar1 = write_full(iVar2,out,sVar4);
    if (bVar1 == '\0') {
      pcVar3 = "log_option: failed to write msgtype_rules";
      goto LAB_001b0037;
    }
LAB_001b003e:
    free(out);
    free(pcVar3);
  default:
    goto switchD_001aff00_default;
  }
  lprintf(pcVar3);
switchD_001aff00_default:
  _Var5 = lseek(logfile,0,1);
  last_cmd_pos = (uint)_Var5;
  return;
}

Assistant:

void log_option(struct nh_option_desc *opt)
{
    char encbuf[ENCBUFSZ];
    char *str, *encbuf2;
    
    if (iflags.disable_log || logfile == -1)
	return;
    
    base64_encode(opt->name, encbuf);
    lprintf("\n!%s:", encbuf);
    
    switch (opt->type) {
	case OPTTYPE_STRING:
	    str = opt->value.s ? opt->value.s : "";
	    base64_encode(str, encbuf);
	    lprintf("s:%s", encbuf);
	    break;
	    
	case OPTTYPE_ENUM:
	    lprintf("e:%x", opt->value.e);
	    break;
	    
	case OPTTYPE_INT:
	    lprintf("i:%d", opt->value.i);
	    break;
	    
	case OPTTYPE_BOOL:
	    lprintf("b:%x", !!opt->value.b);
	    break;
	
	case OPTTYPE_AUTOPICKUP_RULES:
	    str = autopickup_to_string(opt->value.ar);
	    lprintf("a:");
	    encbuf2 = malloc(base64size(strlen(str)));
	    base64_encode(str, encbuf2);
	    /* write directly, large numbers of rules might overflow outbuf in lprintf */
	    if (!write_full(logfile, encbuf2, strlen(encbuf2)))
		panic("log_option: failed to write autopickup_rules");
	    free(encbuf2);
	    free(str);
	    break;
	    
	case OPTTYPE_MSGTYPE:
	    str = msgtype_to_string(opt->value.mt);
	    lprintf("m:");
	    encbuf2 = malloc(base64size(strlen(str)));
	    base64_encode(str, encbuf2);
	    /* write directly, large numbers of rules may overflow outbuf in lprintf */
	    if (!write_full(logfile, encbuf2, strlen(encbuf2)))
		panic("log_option: failed to write msgtype_rules");
	    free(encbuf2);
	    free(str);
	    break;
    }
    
    last_cmd_pos = lseek(logfile, 0, SEEK_CUR);
}